

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O2

cell * references::scheme::proc_less(cell *__return_storage_ptr__,cells *c)

{
  pointer pcVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  
  pcVar1 = (c->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = atol((pcVar1->val)._M_dataplus._M_p);
  pcVar2 = (c->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar5 = true_sym;
  do {
    if (pcVar1 + 1 == pcVar2) goto LAB_00119b08;
    lVar4 = atol(pcVar1[1].val._M_dataplus._M_p);
    pcVar1 = pcVar1 + 1;
  } while (lVar3 < lVar4);
  puVar5 = false_sym;
LAB_00119b08:
  cell::cell(__return_storage_ptr__,(cell *)puVar5);
  return __return_storage_ptr__;
}

Assistant:

cell proc_less(const cells & c)
{
	long n(atol(c[0].val.c_str()));
	for (cellit i = c.begin() + 1; i != c.end(); ++i)
		if (n >= atol(i->val.c_str()))
			return false_sym;
	return true_sym;
}